

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

int xmlXIncludeProcessTreeFlagsData(xmlNodePtr tree,int flags,void *data)

{
  xmlDocPtr pxVar1;
  int iVar2;
  xmlXIncludeCtxtPtr ctxt;
  
  iVar2 = -1;
  if (((tree != (xmlNodePtr)0x0) && (tree->type != XML_NAMESPACE_DECL)) &&
     (pxVar1 = tree->doc, pxVar1 != (xmlDocPtr)0x0)) {
    ctxt = (xmlXIncludeCtxtPtr)(*xmlMalloc)(0x88);
    if (ctxt != (xmlXIncludeCtxtPtr)0x0) {
      *(undefined8 *)&ctxt->parseFlags = 0;
      ctxt->_private = (void *)0x0;
      ctxt->resourceLoader = (xmlResourceLoader)0x0;
      ctxt->resourceCtxt = (void *)0x0;
      ctxt->errorHandler = (xmlStructuredErrorFunc)0x0;
      ctxt->errorCtxt = (void *)0x0;
      ctxt->depth = 0;
      ctxt->isStream = 0;
      ctxt->xpctxt = (xmlXPathContextPtr)0x0;
      ctxt->nbErrors = 0;
      ctxt->fatalErr = 0;
      ctxt->errNo = 0;
      ctxt->legacy = 0;
      ctxt->urlNr = 0;
      ctxt->urlMax = 0;
      ctxt->urlTab = (xmlXIncludeDoc *)0x0;
      ctxt->txtNr = 0;
      ctxt->txtMax = 0;
      ctxt->txtTab = (xmlXIncludeTxt *)0x0;
      ctxt->doc = pxVar1;
      ctxt->incNr = 0;
      ctxt->incMax = 0;
      ctxt->incTab = (xmlXIncludeRefPtr *)0x0;
      ctxt->_private = data;
      ctxt->parseFlags = flags;
      iVar2 = -1;
      if (tree->type != XML_NAMESPACE_DECL) {
        iVar2 = xmlXIncludeDoProcess(ctxt,tree);
        if ((-1 < iVar2) && (0 < ctxt->nbErrors)) {
          iVar2 = -1;
        }
      }
      xmlXIncludeFreeContext(ctxt);
    }
  }
  return iVar2;
}

Assistant:

int
xmlXIncludeProcessTreeFlagsData(xmlNodePtr tree, int flags, void *data) {
    xmlXIncludeCtxtPtr ctxt;
    int ret = 0;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL) ||
        (tree->doc == NULL))
        return(-1);

    ctxt = xmlXIncludeNewContext(tree->doc);
    if (ctxt == NULL)
        return(-1);
    ctxt->_private = data;
    xmlXIncludeSetFlags(ctxt, flags);
    ret = xmlXIncludeDoProcessRoot(ctxt, tree);
    if ((ret >= 0) && (ctxt->nbErrors > 0))
        ret = -1;

    xmlXIncludeFreeContext(ctxt);
    return(ret);
}